

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIntegerMixTests.cpp
# Opt level: O1

qpTestResult __thiscall deqp::ShaderIntegerMixRenderCase::test(ShaderIntegerMixRenderCase *this)

{
  deInt32 *pdVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  char *pcVar4;
  RenderContext *renderCtx;
  long *plVar5;
  uint uVar6;
  ShaderIntegerMixRenderCase *this_00;
  bool bVar7;
  int i;
  int iVar8;
  deUint32 dVar9;
  GLenum GVar10;
  undefined4 uVar11;
  undefined4 extraout_var;
  char *__s;
  mapped_type *pmVar12;
  long lVar13;
  ulong uVar14;
  TestError *pTVar15;
  uint uVar16;
  ulong uVar17;
  byte bVar18;
  deUint32 dVar19;
  long lVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  deUint32 dVar22;
  int iVar23;
  deUint32 *pdVar24;
  uint uVar25;
  char *pcVar26;
  IVec4 *pIVar27;
  deUint32 *pdVar28;
  int i_2;
  deUint32 *pdVar29;
  int i_1;
  uint *puVar30;
  deUint32 local_4f9c;
  GLuint tex;
  GLuint fbo;
  undefined1 local_4f90 [8];
  long *local_4f88;
  deUint32 *local_4f80;
  long local_4f78 [2];
  int local_4f68;
  long local_4f60;
  TestLog *local_4f58;
  deUint32 local_4f4c;
  ShaderIntegerMixRenderCase *local_4f48;
  long *local_4f40;
  long local_4f38;
  long local_4f30 [2];
  long *local_4f20;
  long local_4f18;
  long local_4f10 [2];
  ulong local_4f00;
  long *local_4ef8;
  long local_4ef0;
  long local_4ee8 [2];
  long *local_4ed8;
  long local_4ed0;
  long local_4ec8 [2];
  string fs_code;
  string vs_code;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  VertexArrayBinding vertexArrays [4];
  ShaderProgram prog;
  deInt32 a [1024];
  deInt32 b [1024];
  float vertex [512];
  IVec4 expected [256];
  deUint32 pointIndices [256];
  deInt32 sel [1024];
  
  local_4f58 = ((this->super_ShaderIntegerMixCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
  iVar8 = (*((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  bVar7 = glu::glslVersionIsES((this->super_ShaderIntegerMixCase).m_glslVersion);
  if (bVar7 && (1 < (int)(this->super_ShaderIntegerMixCase).m_glslVersion || !bVar7)) {
    pcVar26 = glcts::fixed_sample_locations_values + 1;
  }
  else {
    bVar7 = glu::ContextInfo::isExtensionSupported
                      (((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_contextInfo,
                       "GL_EXT_shader_integer_mix");
    if (!bVar7) {
      return QP_TEST_RESULT_NOT_SUPPORTED;
    }
    pcVar26 = "#extension GL_EXT_shader_integer_mix: enable";
  }
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._M_t._M_impl.super__Rb_tree_header._M_header;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  __s = glu::getGLSLVersionDeclaration((this->super_ShaderIntegerMixCase).m_glslVersion);
  pdVar1 = a + 4;
  a._0_8_ = pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)a,"VERSION_DECL","");
  local_4f60 = CONCAT44(extraout_var,iVar8);
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&args,(key_type *)a);
  pcVar4 = (char *)pmVar12->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar12,0,pcVar4,(ulong)__s);
  if ((deInt32 *)a._0_8_ != pdVar1) {
    operator_delete((void *)a._0_8_,a._16_8_ + 1);
  }
  a._0_8_ = pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)a,"EXTENSION_ENABLE","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&args,(key_type *)a);
  pcVar4 = (char *)pmVar12->_M_string_length;
  strlen(pcVar26);
  std::__cxx11::string::_M_replace((ulong)pmVar12,0,pcVar4,(ulong)pcVar26);
  if ((deInt32 *)a._0_8_ != pdVar1) {
    operator_delete((void *)a._0_8_,a._16_8_ + 1);
  }
  pcVar26 = this->type;
  a._0_8_ = pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)a,"TYPE","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&args,(key_type *)a);
  pcVar4 = (char *)pmVar12->_M_string_length;
  strlen(pcVar26);
  std::__cxx11::string::_M_replace((ulong)pmVar12,0,pcVar4,(ulong)pcVar26);
  if ((deInt32 *)a._0_8_ != pdVar1) {
    operator_delete((void *)a._0_8_,a._16_8_ + 1);
  }
  pdVar1 = b + 4;
  b._0_8_ = pdVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)b,
             "${VERSION_DECL}\n${EXTENSION_ENABLE}\n\nin vec2 vertex;\nin ivec4 vs_in_a;\nin ivec4 vs_in_b;\nin ivec4 vs_in_sel;\n\nflat out ivec4 fs_in_a;\nflat out ivec4 fs_in_b;\nflat out ivec4 fs_in_sel;\nflat out ivec4 fs_in_result;\n\nvoid main()\n{\n    fs_in_a = vs_in_a;\n    fs_in_b = vs_in_b;\n    fs_in_sel = vs_in_sel;\n\n    ${TYPE} a = ${TYPE}(vs_in_a);\n    ${TYPE} b = ${TYPE}(vs_in_b);\n    bvec4 sel = bvec4(vs_in_sel);\n    fs_in_result = ivec4(mix(a, b, sel));\n\n    gl_Position = vec4(vertex, 0, 1);\n    gl_PointSize = 4.;\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)a,(string *)b);
  tcu::StringTemplate::specialize(&vs_code,(StringTemplate *)a,&args);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)a);
  if ((deInt32 *)b._0_8_ != pdVar1) {
    operator_delete((void *)b._0_8_,b._16_8_ + 1);
  }
  b._0_8_ = pdVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)b,
             "${VERSION_DECL}\n${EXTENSION_ENABLE}\n\nout ivec4 o;\n\nflat in ivec4 fs_in_a;\nflat in ivec4 fs_in_b;\nflat in ivec4 fs_in_sel;\nflat in ivec4 fs_in_result;\n\nuniform bool use_vs_data;\n\nvoid main()\n{\n    if (use_vs_data)\n        o = fs_in_result;\n    else {\n        ${TYPE} a = ${TYPE}(fs_in_a);\n        ${TYPE} b = ${TYPE}(fs_in_b);\n        bvec4 sel = bvec4(fs_in_sel);\n        o = ivec4(mix(a, b, sel));\n    }\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)a,(string *)b);
  tcu::StringTemplate::specialize(&fs_code,(StringTemplate *)a,&args);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)a);
  if ((deInt32 *)b._0_8_ != pdVar1) {
    operator_delete((void *)b._0_8_,b._16_8_ + 1);
  }
  renderCtx = ((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)b,vs_code._M_dataplus._M_p,(allocator<char> *)expected);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)sel,fs_code._M_dataplus._M_p,(allocator<char> *)vertex);
  a[0x30]._0_1_ = 0;
  a._193_8_ = 0;
  a[0x2c] = 0;
  a[0x2d] = 0;
  a[0x2e]._0_1_ = 0;
  a._185_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)a,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)a,(value_type *)b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(a + 6),(value_type *)sel);
  glu::ShaderProgram::ShaderProgram(&prog,renderCtx,(ProgramSources *)a);
  lVar13 = local_4f60;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(a + 0x2c));
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             (a + 0x24));
  lVar20 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)a + lVar20));
    lVar20 = lVar20 + -0x18;
  } while (lVar20 != -0x18);
  if ((deInt32 *)sel._0_8_ != sel + 4) {
    operator_delete((void *)sel._0_8_,sel._16_8_ + 1);
  }
  if ((deInt32 *)b._0_8_ != pdVar1) {
    operator_delete((void *)b._0_8_,b._16_8_ + 1);
  }
  if (prog.m_program.m_info.linkOk != false) {
    bVar7 = glu::glslVersionIsES((this->super_ShaderIntegerMixCase).m_glslVersion);
    if (!bVar7) {
      glwEnable(0x8642);
    }
    glwGenTextures(1,&tex);
    glwBindTexture(0xde1,tex);
    glwTexImage2D(0xde1,0,0x8d82,0x40,0x40,0,0x8d99,0x1404,(void *)0x0);
    glwBindTexture(0xde1,0);
    glwGenFramebuffers(1,&fbo);
    glwBindFramebuffer(0x8ca9,fbo);
    glwBindFramebuffer(0x8ca8,fbo);
    glwFramebufferTexture2D(0x8ca9,0x8ce0,0xde1,tex,0);
    dVar9 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar9,"Creation of rendering FBO failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderIntegerMixTests.cpp"
                    ,0x184);
    GVar10 = glwCheckFramebufferStatus(0x8ca9);
    if (GVar10 == 0x8cd5) {
      dVar19 = 0;
      glwViewport(0,0,0x40,0x40);
      local_4f48 = this;
      memset(expected,0,0x1000);
      this_00 = local_4f48;
      lVar13 = 0;
      local_4f9c = 0;
      iVar8 = 0;
      dVar22 = 0;
      iVar23 = 0;
      uVar17 = 0;
      uVar25 = 0;
      uVar14 = 0;
      dVar9 = 0;
      do {
        local_4f4c = dVar9;
        local_4f00 = uVar14;
        uVar16 = (uint)uVar17;
        uVar6 = (uint)(uVar17 >> 1);
        b[lVar13] = iVar23 - 1;
        b[lVar13 + 1] = iVar8 - 1;
        b[lVar13 + 2] = (int)local_4f00 - 1;
        dVar19 = dVar19 - 1;
        sel[lVar13] = uVar16 & 1;
        a[lVar13] = uVar16;
        puVar30 = (uint *)(b + lVar13);
        if ((uVar17 & 1) == 0) {
          puVar30 = (uint *)(a + lVar13);
        }
        a[lVar13 + 1] = local_4f9c;
        pdVar28 = (deUint32 *)(b + lVar13 + 1);
        if ((uVar17 >> 1 & 1) == 0) {
          pdVar28 = (deUint32 *)(a + lVar13 + 1);
        }
        sel[lVar13 + 1] = uVar6 & 1;
        sel[lVar13 + 2] = (uint)(uVar17 >> 2) & 1;
        a[lVar13 + 2] = local_4f4c;
        pdVar29 = (deUint32 *)(b + lVar13 + 2);
        if ((uVar17 >> 2 & 1) == 0) {
          pdVar29 = (deUint32 *)(a + lVar13 + 2);
        }
        a[lVar13 + 3] = dVar22;
        sel[lVar13 + 3] = (uint)(uVar17 >> 3) & 1;
        b[lVar13 + 3] = dVar19;
        pdVar24 = (deUint32 *)(b + lVar13 + 3);
        if ((uVar17 >> 3 & 1) == 0) {
          pdVar24 = (deUint32 *)(a + lVar13 + 3);
        }
        *(float *)((long)vertex + lVar13 * 2) = (float)(uVar6 & 0x78 | 4) * 0.015625 + -1.0;
        *(uint *)((long)pointIndices + lVar13) = uVar16;
        *(float *)((long)vertex + lVar13 * 2 + 4) = (float)(uVar25 & 0x78 | 4) * 0.015625 + -1.0;
        dVar9 = *pdVar28;
        dVar2 = *pdVar29;
        dVar3 = *pdVar24;
        expected[0].m_data[lVar13] = *puVar30;
        pointIndices[lVar13 + -0x3ff] = dVar9;
        pointIndices[lVar13 + -0x3fe] = dVar2;
        pointIndices[lVar13 + -0x3fd] = dVar3;
        uVar25 = uVar25 + 8;
        uVar17 = (ulong)(uVar16 + 1);
        iVar23 = iVar23 + -0xb;
        dVar22 = dVar22 + 0xb;
        iVar8 = iVar8 + -7;
        local_4f9c = local_4f9c + 5;
        lVar13 = lVar13 + 4;
        uVar14 = (ulong)((int)local_4f00 - 5);
        dVar9 = local_4f4c + 7;
      } while (lVar13 != 0x400);
      if (*local_4f48->type == 'b') {
        uVar14 = 0;
        do {
          a[uVar14] = a[uVar14] & 1;
          b[uVar14] = b[uVar14] & 1;
          uVar17 = uVar14 >> 2 & 0x3fffffff;
          expected[uVar17].m_data[0] = expected[uVar17].m_data[0] & 1;
          expected[uVar17].m_data[1] = expected[uVar17].m_data[1] & 1;
          expected[uVar17].m_data[2] = expected[uVar17].m_data[2] & 1;
          expected[uVar17].m_data[3] = expected[uVar17].m_data[3] & 1;
          uVar14 = uVar14 + 1;
        } while (uVar14 != 0x400);
      }
      local_4f20 = local_4f10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f20,"vertex","");
      local_4f90._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
      local_4f88 = local_4f78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4f88,local_4f20,local_4f18 + (long)local_4f20);
      local_4f68 = 0;
      vertexArrays[0].binding.type = local_4f90._0_4_;
      vertexArrays[0].binding.name._M_dataplus._M_p = (pointer)&vertexArrays[0].binding.name.field_2
      ;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&vertexArrays[0].binding.name,local_4f88,
                 (long)local_4f80 + (long)local_4f88);
      pIVar27 = expected;
      vertexArrays[0].binding.location = local_4f68;
      vertexArrays[0].pointer.componentType = VTX_COMP_FLOAT;
      vertexArrays[0].pointer.convert = VTX_COMP_CONVERT_NONE;
      vertexArrays[0].pointer.numComponents = 2;
      vertexArrays[0].pointer.numElements = 0x100;
      vertexArrays[0].pointer.stride = 0;
      vertexArrays[0].pointer.data = vertex;
      if (local_4f88 != local_4f78) {
        operator_delete(local_4f88,local_4f78[0] + 1);
      }
      local_4ed8 = local_4ec8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4ed8,"vs_in_a","");
      local_4f90._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
      local_4f88 = local_4f78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4f88,local_4ed8,local_4ed0 + (long)local_4ed8);
      local_4f68 = 0;
      vertexArrays[1].binding.type = local_4f90._0_4_;
      vertexArrays[1].binding.name._M_dataplus._M_p = (pointer)&vertexArrays[1].binding.name.field_2
      ;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&vertexArrays[1].binding.name,local_4f88,
                 (long)local_4f80 + (long)local_4f88);
      vertexArrays[1].binding.location = local_4f68;
      vertexArrays[1].pointer.componentType = VTX_COMP_SIGNED_INT32;
      vertexArrays[1].pointer.convert = VTX_COMP_CONVERT_NONE;
      vertexArrays[1].pointer.numComponents = 4;
      vertexArrays[1].pointer.numElements = 0x100;
      vertexArrays[1].pointer.stride = 0;
      vertexArrays[1].pointer.data = a;
      if (local_4f88 != local_4f78) {
        operator_delete(local_4f88,local_4f78[0] + 1);
      }
      local_4f40 = local_4f30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f40,"vs_in_b","");
      local_4f90._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
      local_4f88 = local_4f78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4f88,local_4f40,local_4f38 + (long)local_4f40);
      local_4f68 = 0;
      vertexArrays[2].binding.type = local_4f90._0_4_;
      vertexArrays[2].binding.name._M_dataplus._M_p = (pointer)&vertexArrays[2].binding.name.field_2
      ;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&vertexArrays[2].binding.name,local_4f88,
                 (long)local_4f80 + (long)local_4f88);
      vertexArrays[2].binding.location = local_4f68;
      vertexArrays[2].pointer.componentType = VTX_COMP_SIGNED_INT32;
      vertexArrays[2].pointer.convert = VTX_COMP_CONVERT_NONE;
      vertexArrays[2].pointer.numComponents = 4;
      vertexArrays[2].pointer.numElements = 0x100;
      vertexArrays[2].pointer.stride = 0;
      vertexArrays[2].pointer.data = b;
      if (local_4f88 != local_4f78) {
        operator_delete(local_4f88,local_4f78[0] + 1);
      }
      local_4ef8 = local_4ee8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4ef8,"vs_in_sel","");
      local_4f90._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
      local_4f88 = local_4f78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4f88,local_4ef8,local_4ef0 + (long)local_4ef8);
      local_4f68 = 0;
      vertexArrays[3].binding.type = local_4f90._0_4_;
      paVar21 = &vertexArrays[3].binding.name.field_2;
      vertexArrays[3].binding.name._M_dataplus._M_p = (pointer)paVar21;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&vertexArrays[3].binding.name,local_4f88,
                 (long)local_4f80 + (long)local_4f88);
      vertexArrays[3].binding.location = local_4f68;
      vertexArrays[3].pointer.componentType = VTX_COMP_SIGNED_INT32;
      vertexArrays[3].pointer.convert = VTX_COMP_CONVERT_NONE;
      vertexArrays[3].pointer.numComponents = 4;
      vertexArrays[3].pointer.numElements = 0x100;
      vertexArrays[3].pointer.stride = 0;
      vertexArrays[3].pointer.data = sel;
      if (local_4f88 != local_4f78) {
        operator_delete(local_4f88,local_4f78[0] + 1);
      }
      lVar13 = local_4f60;
      if (local_4ef8 != local_4ee8) {
        operator_delete(local_4ef8,local_4ee8[0] + 1);
      }
      if (local_4f40 != local_4f30) {
        operator_delete(local_4f40,local_4f30[0] + 1);
      }
      if (local_4ed8 != local_4ec8) {
        operator_delete(local_4ed8,local_4ec8[0] + 1);
      }
      if (local_4f20 != local_4f10) {
        operator_delete(local_4f20,local_4f10[0] + 1);
      }
      uVar11 = (**(code **)(lVar13 + 0xb48))(prog.m_program.m_program);
      (**(code **)(lVar13 + 0x1680))(prog.m_program.m_program);
      glwClearBufferiv(0x1800,0,test::clear);
      (**(code **)(lVar13 + 0x14f0))(uVar11,0);
      local_4f90._0_4_ = PRIMITIVETYPE_POINTS;
      local_4f90._4_4_ = 0x100;
      local_4f88 = (long *)CONCAT44(local_4f88._4_4_,INDEXTYPE_UINT32);
      local_4f80 = pointIndices;
      glu::draw(((this_00->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_renderCtx,
                prog.m_program.m_program,4,vertexArrays,(PrimitiveList *)local_4f90,
                (DrawUtilCallback *)0x0);
      bVar18 = 1;
      lVar13 = 0;
      do {
        bVar7 = probe_pixel(this_00,local_4f58,"Fragment",
                            (int)((vertex[lVar13 * 2] + 1.0) * 64.0 * 0.5),
                            (int)((vertex[lVar13 * 2 + 1] + 1.0) * 64.0 * 0.5),pIVar27);
        bVar18 = bVar18 & bVar7;
        lVar13 = lVar13 + 1;
        pIVar27 = pIVar27 + 1;
      } while (lVar13 != 0x100);
      (**(code **)(local_4f60 + 0x14f0))(uVar11,1);
      local_4f90._0_4_ = PRIMITIVETYPE_POINTS;
      local_4f90._4_4_ = 0x100;
      local_4f88 = (long *)CONCAT44(local_4f88._4_4_,INDEXTYPE_UINT32);
      local_4f80 = pointIndices;
      glu::draw(((this_00->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_renderCtx,
                prog.m_program.m_program,4,vertexArrays,(PrimitiveList *)local_4f90,
                (DrawUtilCallback *)0x0);
      pIVar27 = expected;
      lVar13 = 0;
      do {
        bVar7 = probe_pixel(local_4f48,local_4f58,"Vertex",
                            (int)((vertex[lVar13 * 2] + 1.0) * 64.0 * 0.5),
                            (int)((vertex[lVar13 * 2 + 1] + 1.0) * 64.0 * 0.5),pIVar27);
        bVar18 = bVar18 & bVar7;
        lVar13 = lVar13 + 1;
        pIVar27 = pIVar27 + 1;
      } while (lVar13 != 0x100);
      glwDeleteFramebuffers(1,&fbo);
      glwDeleteTextures(1,&tex);
      lVar13 = -0x140;
      do {
        plVar5 = (long *)(((string *)(paVar21 + -1))->_M_dataplus)._M_p;
        if (paVar21 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar5) {
          operator_delete(plVar5,paVar21->_M_allocated_capacity + 1);
        }
        paVar21 = paVar21 + -5;
        lVar13 = lVar13 + 0x50;
      } while (lVar13 != 0);
      glu::ShaderProgram::~ShaderProgram(&prog);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fs_code._M_dataplus._M_p != &fs_code.field_2) {
        operator_delete(fs_code._M_dataplus._M_p,fs_code.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vs_code._M_dataplus._M_p != &vs_code.field_2) {
        operator_delete(vs_code._M_dataplus._M_p,vs_code.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&args._M_t);
      return (uint)(bVar18 ^ 1);
    }
    pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar15,"Framebuffer not complete.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderIntegerMixTests.cpp"
               ,0x187);
    __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  glu::operator<<(local_4f58,&prog);
  pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar15,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderIntegerMixTests.cpp"
             ,0x16e);
  __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

virtual qpTestResult test()
	{
		static const char vs_template[] = "${VERSION_DECL}\n"
										  "${EXTENSION_ENABLE}\n"
										  "\n"
										  "in vec2 vertex;\n"
										  "in ivec4 vs_in_a;\n"
										  "in ivec4 vs_in_b;\n"
										  "in ivec4 vs_in_sel;\n"
										  "\n"
										  "flat out ivec4 fs_in_a;\n"
										  "flat out ivec4 fs_in_b;\n"
										  "flat out ivec4 fs_in_sel;\n"
										  "flat out ivec4 fs_in_result;\n"
										  "\n"
										  "void main()\n"
										  "{\n"
										  "    fs_in_a = vs_in_a;\n"
										  "    fs_in_b = vs_in_b;\n"
										  "    fs_in_sel = vs_in_sel;\n"
										  "\n"
										  "    ${TYPE} a = ${TYPE}(vs_in_a);\n"
										  "    ${TYPE} b = ${TYPE}(vs_in_b);\n"
										  "    bvec4 sel = bvec4(vs_in_sel);\n"
										  "    fs_in_result = ivec4(mix(a, b, sel));\n"
										  "\n"
										  "    gl_Position = vec4(vertex, 0, 1);\n"
										  "    gl_PointSize = 4.;\n"
										  "}\n";

		static const char fs_template[] = "${VERSION_DECL}\n"
										  "${EXTENSION_ENABLE}\n"
										  "\n"
										  "out ivec4 o;\n"
										  "\n"
										  "flat in ivec4 fs_in_a;\n"
										  "flat in ivec4 fs_in_b;\n"
										  "flat in ivec4 fs_in_sel;\n"
										  "flat in ivec4 fs_in_result;\n"
										  "\n"
										  "uniform bool use_vs_data;\n"
										  "\n"
										  "void main()\n"
										  "{\n"
										  "    if (use_vs_data)\n"
										  "        o = fs_in_result;\n"
										  "    else {\n"
										  "        ${TYPE} a = ${TYPE}(fs_in_a);\n"
										  "        ${TYPE} b = ${TYPE}(fs_in_b);\n"
										  "        bvec4 sel = bvec4(fs_in_sel);\n"
										  "        o = ivec4(mix(a, b, sel));\n"
										  "    }\n"
										  "}\n";

		TestLog&			  log  = m_testCtx.getLog();
		const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
		bool				  pass = true;
		const char*			  extension_enable;
		bool				  is_es = glslVersionIsES(m_glslVersion);

		if ((is_es && (m_glslVersion < glu::GLSL_VERSION_310_ES)) || !is_es)
		{
			/* For versions that do not support this feature in Core it must be exposed via an extension. */
			if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_shader_integer_mix"))
			{
				return QP_TEST_RESULT_NOT_SUPPORTED;
			}

			extension_enable = "#extension GL_EXT_shader_integer_mix: enable";
		}
		else
		{
			extension_enable = "";
		}

		/* Generate the specialization of the shader for the specific
		 * type being tested.
		 */
		std::map<std::string, std::string> args;

		args["VERSION_DECL"]	 = glu::getGLSLVersionDeclaration(m_glslVersion);
		args["EXTENSION_ENABLE"] = extension_enable;
		args["TYPE"]			 = type;

		std::string vs_code = tcu::StringTemplate(vs_template).specialize(args);

		std::string fs_code = tcu::StringTemplate(fs_template).specialize(args);

		glu::ShaderProgram prog(m_context.getRenderContext(),
								glu::makeVtxFragSources(vs_code.c_str(), fs_code.c_str()));

		if (!prog.isOk())
		{
			log << prog;
			TCU_FAIL("Compile failed");
		}

		if (!glslVersionIsES(m_glslVersion))
			glEnable(GL_PROGRAM_POINT_SIZE);

		/* Generate an integer FBO for rendering.
		 */
		GLuint fbo;
		GLuint tex;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glTexImage2D(GL_TEXTURE_2D, 0 /* level */, GL_RGBA32I, width, height, 0 /* border */, GL_RGBA_INTEGER, GL_INT,
					 NULL /* data */);
		glBindTexture(GL_TEXTURE_2D, 0);

		glGenFramebuffers(1, &fbo);
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, fbo);
		glBindFramebuffer(GL_READ_FRAMEBUFFER, fbo);
		glFramebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0 /* level */);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Creation of rendering FBO failed.");

		if (glCheckFramebufferStatus(GL_DRAW_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			TCU_FAIL("Framebuffer not complete.");

		glViewport(0, 0, width, height);

		/* Fill a VBO with some vertex data.
		 */
		deUint32   pointIndices[256];
		float	  vertex[DE_LENGTH_OF_ARRAY(pointIndices) * 2];
		deInt32	a[DE_LENGTH_OF_ARRAY(pointIndices) * 4];
		deInt32	b[DE_LENGTH_OF_ARRAY(a)];
		deInt32	sel[DE_LENGTH_OF_ARRAY(a)];
		tcu::IVec4 expected[DE_LENGTH_OF_ARRAY(pointIndices)];

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(pointIndices); i++)
		{
			pointIndices[i] = deUint16(i);

			const int x = (i / 16) * (width / 16) + (4 / 2);
			const int y = (i % 16) * (height / 16) + (4 / 2);

			vertex[(i * 2) + 0] = float(x) * 2.0f / float(width) - 1.0f;
			vertex[(i * 2) + 1] = float(y) * 2.0f / float(height) - 1.0f;

			a[(i * 4) + 0] = i;
			a[(i * 4) + 1] = i * 5;
			a[(i * 4) + 2] = i * 7;
			a[(i * 4) + 3] = i * 11;

			b[(i * 4) + 0] = ~a[(i * 4) + 3];
			b[(i * 4) + 1] = ~a[(i * 4) + 2];
			b[(i * 4) + 2] = ~a[(i * 4) + 1];
			b[(i * 4) + 3] = ~a[(i * 4) + 0];

			sel[(i * 4) + 0] = (i >> 0) & 1;
			sel[(i * 4) + 1] = (i >> 1) & 1;
			sel[(i * 4) + 2] = (i >> 2) & 1;
			sel[(i * 4) + 3] = (i >> 3) & 1;

			expected[i] = tcu::IVec4(
				sel[(i * 4) + 0] ? b[(i * 4) + 0] : a[(i * 4) + 0], sel[(i * 4) + 1] ? b[(i * 4) + 1] : a[(i * 4) + 1],
				sel[(i * 4) + 2] ? b[(i * 4) + 2] : a[(i * 4) + 2], sel[(i * 4) + 3] ? b[(i * 4) + 3] : a[(i * 4) + 3]);
		}

		/* Mask off all but the least significant bit for boolean
		 * types.
		 */
		if (type[0] == 'b')
		{
			for (int i = 0; i < DE_LENGTH_OF_ARRAY(a); i++)
			{
				a[i] &= 1;
				b[i] &= 1;

				expected[i / 4][0] &= 1;
				expected[i / 4][1] &= 1;
				expected[i / 4][2] &= 1;
				expected[i / 4][3] &= 1;
			}
		}

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("vertex", 2, DE_LENGTH_OF_ARRAY(pointIndices), 0, vertex),
			glu::va::Int32("vs_in_a", 4, DE_LENGTH_OF_ARRAY(pointIndices), 0, a),
			glu::va::Int32("vs_in_b", 4, DE_LENGTH_OF_ARRAY(pointIndices), 0, b),
			glu::va::Int32("vs_in_sel", 4, DE_LENGTH_OF_ARRAY(pointIndices), 0, sel)
		};

		/* Render and verify the results.  Rendering happens twice.
		 * The first time, use_vs_data is false, and the mix() result
		 * from the fragment shader is used.  The second time,
		 * use_vs_data is true, and the mix() result from the vertex
		 * shader is used.
		 */
		const GLint loc = gl.getUniformLocation(prog.getProgram(), "use_vs_data");
		gl.useProgram(prog.getProgram());

		static const GLint clear[] = { 1, 2, 3, 4 };
		glClearBufferiv(GL_COLOR, 0, clear);

		gl.uniform1i(loc, 0);
		glu::draw(m_context.getRenderContext(), prog.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
				  glu::pr::Points(DE_LENGTH_OF_ARRAY(pointIndices), pointIndices));

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(pointIndices); i++)
		{
			const int x = int((vertex[(i * 2) + 0] + 1.0f) * float(width) / 2.0f);
			const int y = int((vertex[(i * 2) + 1] + 1.0f) * float(height) / 2.0f);

			pass = probe_pixel(log, "Fragment", x, y, expected[i]) && pass;
		}

		gl.uniform1i(loc, 1);
		glu::draw(m_context.getRenderContext(), prog.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
				  glu::pr::Points(DE_LENGTH_OF_ARRAY(pointIndices), pointIndices));

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(pointIndices); i++)
		{
			const int x = int((vertex[(i * 2) + 0] + 1.0f) * float(width) / 2.0f);
			const int y = int((vertex[(i * 2) + 1] + 1.0f) * float(height) / 2.0f);

			pass = probe_pixel(log, "Vertex", x, y, expected[i]) && pass;
		}

		glDeleteFramebuffers(1, &fbo);
		glDeleteTextures(1, &tex);

		return pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL;
	}